

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalTableScan,duckdb::vector<duckdb::LogicalType,true>&,duckdb::TableFunction&,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::ColumnIndex,true>&,duckdb::vector<unsigned_long,true>&,duckdb::vector<std::__cxx11::string,true>&,duckdb::unique_ptr<duckdb::TableFilterSet,std::default_delete<duckdb::TableFilterSet>,true>,unsigned_long&,duckdb::ExtraOperatorInfo&,duckdb::vector<duckdb::Value,true>,std::unordered_map<unsigned_long,duckdb::TableColumn,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>>>
          (PhysicalPlan *this,vector<duckdb::LogicalType,_true> *args,TableFunction *args_1,
          unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *args_2,
          vector<duckdb::LogicalType,_true> *args_3,vector<duckdb::ColumnIndex,_true> *args_4,
          vector<unsigned_long,_true> *args_5,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *args_6,unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                  *args_7,unsigned_long *args_8,ExtraOperatorInfo *args_9,
          vector<duckdb::Value,_true> *args_10,
          unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
          *args_11)

{
  idx_t estimated_cardinality;
  PhysicalTableScan *pPVar1;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_310;
  _Head_base<0UL,_duckdb::TableFilterSet_*,_false> local_308;
  PhysicalTableScan *local_300;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_2f8;
  vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> local_2e0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2c8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2b0;
  vector<duckdb::Value,_true> local_298;
  reference_wrapper<duckdb::PhysicalOperator> local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270 [24];
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_258;
  ExtraOperatorInfo local_220;
  TableFunction local_1e8;
  
  local_300 = (PhysicalTableScan *)ArenaAllocator::AllocateAligned(&this->arena,0x340);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2b0,
             &args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  TableFunction::TableFunction(&local_1e8,args_1);
  local_310._M_head_impl =
       (args_2->super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>).
       _M_t.super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  (args_2->super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)._M_t.
  super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = (FunctionData *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2c8,
             &args_3->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::vector
            (&local_2e0,
             &args_4->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2f8,
             &args_5->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_270,
           &args_6->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  local_308._M_head_impl =
       (args_7->
       super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>)._M_t.
       super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
       .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl;
  (args_7->super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>).
  _M_t.super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>.
  super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl = (TableFilterSet *)0x0;
  estimated_cardinality = *args_8;
  ExtraOperatorInfo::ExtraOperatorInfo(&local_220,args_9);
  local_298.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (args_10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_298.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (args_10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_298.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (args_10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (args_10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (args_10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (args_10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_258,&args_11->_M_h);
  PhysicalTableScan::PhysicalTableScan
            (local_300,(vector<duckdb::LogicalType,_true> *)&local_2b0,&local_1e8,
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             &local_310,(vector<duckdb::LogicalType,_true> *)&local_2c8,
             (vector<duckdb::ColumnIndex,_true> *)&local_2e0,
             (vector<unsigned_long,_true> *)&local_2f8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)local_270,
             (unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
              *)&local_308,estimated_cardinality,&local_220,&local_298,
             (virtual_column_map_t *)&local_258);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_258);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_298);
  ExtraOperatorInfo::~ExtraOperatorInfo(&local_220);
  ::std::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>::
  ~unique_ptr((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_> *)
              &local_308);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_270);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_2f8);
  ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector(&local_2e0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2c8);
  if (local_310._M_head_impl != (FunctionData *)0x0) {
    (*(local_310._M_head_impl)->_vptr_FunctionData[1])();
  }
  local_310._M_head_impl = (FunctionData *)0x0;
  TableFunction::~TableFunction(&local_1e8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2b0);
  pPVar1 = local_300;
  local_278._M_data = &local_300->super_PhysicalOperator;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&this->ops,&local_278);
  return &pPVar1->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}